

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poisson_dist.hpp
# Opt level: O2

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,param_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *in_00;
  long lVar3;
  double mu;
  delim_c local_49;
  double local_48;
  param_type local_40;
  
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_40.mu_._0_1_ = 0x28;
  pbVar2 = utility::operator>>(in,(delim_c *)&local_40);
  in_00 = std::istream::_M_extract<double>((double *)pbVar2);
  local_49.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_00,&local_49);
  lVar3 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar3 + 0x20] & 5) == 0) {
    poisson_dist::param_type::param_type(&local_40,local_48);
    poisson_dist::param_type::operator=(P,&local_40);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_40.P_.super__Vector_base<double,_std::allocator<double>_>);
    lVar3 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar3 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(std::basic_istream<char_t, traits_t> &in,
                                                   poisson_dist::param_type &P) {
    double mu;
    std::ios_base::fmtflags flags(in.flags());
    in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
    in >> utility::delim('(') >> mu >> utility::delim(')');
    if (in)
      P = poisson_dist::param_type(mu);
    in.flags(flags);
    return in;
  }